

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bov.hpp
# Opt level: O0

void __thiscall
diy::io::BOV::BOV<std::vector<int,std::allocator<int>>>
          (BOV *this,file *f,vector<int,_std::allocator<int>_> *shape,offset offset)

{
  undefined8 in_RCX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  BOV *in_stack_00000010;
  
  *in_RDI = in_RSI;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x1892e7);
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1892fa);
  in_RDI[7] = in_RCX;
  set_shape<std::vector<int,std::allocator<int>>>(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

BOV(mpi::io::file&    f,
                        const S&          shape  = S(),
                        mpi::io::offset   offset = 0):
                      f_(f), offset_(offset)                            { set_shape(shape); }